

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

int __thiscall Fl_Text_Display::wrap_uses_character(Fl_Text_Display *this,int lineEndPos)

{
  int iVar1;
  uint uVar2;
  Fl_Text_Buffer *pFVar3;
  bool local_2e;
  bool local_2d;
  uint c;
  int lineEndPos_local;
  Fl_Text_Display *this_local;
  
  if (this->mContinuousWrap != 0) {
    pFVar3 = buffer(this);
    iVar1 = Fl_Text_Buffer::length(pFVar3);
    if (lineEndPos != iVar1) {
      pFVar3 = buffer(this);
      uVar2 = Fl_Text_Buffer::char_at(pFVar3,lineEndPos);
      local_2d = true;
      if (uVar2 != 10) {
        if ((uVar2 == 9) || (local_2e = false, uVar2 == 0x20)) {
          pFVar3 = buffer(this);
          iVar1 = Fl_Text_Buffer::length(pFVar3);
          local_2e = lineEndPos + 1 < iVar1;
        }
        local_2d = local_2e;
      }
      return (uint)local_2d;
    }
  }
  return 1;
}

Assistant:

int Fl_Text_Display::wrap_uses_character(int lineEndPos) const {
  IS_UTF8_ALIGNED2(buffer(), lineEndPos)

  unsigned int c;

  if (!mContinuousWrap || lineEndPos == buffer()->length())
    return 1;

  c = buffer()->char_at(lineEndPos);
  return c == '\n' || ((c == '\t' || c == ' ') &&
                       lineEndPos + 1 < buffer()->length());
}